

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindSuchRecord
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S,set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps)

{
  bool bVar1;
  RecordSet *pRVar2;
  reference pAVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  condition local_198;
  int local_130;
  byte local_129;
  int i;
  bool flag;
  int local_11c;
  iterator iStack_118;
  int Found;
  _Base_ptr local_110;
  string local_108 [32];
  RecordSet *local_e8;
  RecordSet *RS;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [8];
  string filename;
  undefined1 local_90 [8];
  Record R;
  iterator it;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps_local;
  STMT *S_local;
  RecordManager *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ans;
  
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  std::_Rb_tree_const_iterator<Addr>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<Addr> *)
             &R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Record::Record((Record *)local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&RS,
                 &this->Direction);
  std::operator+(local_c0,(char *)&RS);
  std::__cxx11::string::~string((string *)&RS);
  std::__cxx11::string::string(local_108,(string *)local_c0);
  pRVar2 = FindRecordSet(this,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  local_e8 = pRVar2;
  local_110 = (_Base_ptr)std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::begin(ps);
  R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_110;
  do {
    iStack_118 = std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::end(ps);
    bVar1 = std::operator!=((_Self *)&R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,
                            &stack0xfffffffffffffee8);
    pRVar2 = local_e8;
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_c0);
      Record::~Record((Record *)local_90);
      return __return_storage_ptr__;
    }
    pAVar3 = std::_Rb_tree_const_iterator<Addr>::operator*
                       ((_Rb_tree_const_iterator<Addr> *)
                        &R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    _i = *pAVar3;
    local_11c = RecordSet::FindRecord(pRVar2,_i,(Record *)local_90);
    if (local_11c == 1) {
      local_129 = 1;
      for (local_130 = 0; uVar6 = (ulong)local_130,
          sVar4 = std::vector<condition,_std::allocator<condition>_>::size(S->c_list), uVar6 < sVar4
          ; local_130 = local_130 + 1) {
        pvVar5 = std::vector<condition,_std::allocator<condition>_>::at(S->c_list,(long)local_130);
        condition::condition(&local_198,pvVar5);
        bVar1 = Record::Check((Record *)local_90,&local_198);
        condition::~condition(&local_198);
        if (!bVar1) {
          local_129 = 0;
          break;
        }
      }
      if ((local_129 & 1) == 1) {
        pAVar3 = std::_Rb_tree_const_iterator<Addr>::operator*
                           ((_Rb_tree_const_iterator<Addr> *)
                            &R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert
                  (__return_storage_ptr__,pAVar3);
      }
    }
    std::_Rb_tree_const_iterator<Addr>::operator++
              ((_Rb_tree_const_iterator<Addr> *)
               &R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,0);
  } while( true );
}

Assistant:

set<Addr> RecordManager::FindSuchRecord(STMT S, set<Addr>ps) {
	set<Addr> ans;
	set<Addr>::iterator it;
	Record R;
	string filename = Direction + S.tableName + "_rcd.dat";
	RecordSet& RS = this->FindRecordSet(filename);
	for (it = ps.begin(); it != ps.end(); it++) {
		int Found = RS.FindRecord(*it, R);
		if (Found != 1)
			continue;				//�õ�ַ�ϵļ�¼��Ч��ֱ�Ӽ����һ��
		else {
			bool flag = true;
			int i;
			for (i = 0; i < S.c_list->size(); i++) {
				if (R.Check(S.c_list->at(i)) == false) {
					flag = false;	//����һ�����������㣬ֱ����̭
					break;
				}
			}
			if (flag == true) {
				ans.insert(*it);		//�������������ģ������ַ������������
			}
		}
	}
	return ans;
}